

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_cid.c
# Opt level: O0

HPDF_STATUS HPDF_CIDFontDef_ChangeStyle(HPDF_FontDef fontdef,HPDF_BOOL bold,HPDF_BOOL italic)

{
  HPDF_BOOL italic_local;
  HPDF_BOOL bold_local;
  HPDF_FontDef fontdef_local;
  
  if ((fontdef == (HPDF_FontDef)0x0) || (fontdef->attr == (void *)0x0)) {
    fontdef_local = (HPDF_FontDef)0x102d;
  }
  else {
    if (bold != 0) {
      fontdef->stemv = fontdef->stemv << 1;
      fontdef->flags = fontdef->flags | 0x40000;
    }
    if (italic != 0) {
      fontdef->italic_angle = fontdef->italic_angle + -0xb;
      fontdef->flags = fontdef->flags | 0x40;
    }
    fontdef_local = (HPDF_FontDef)0x0;
  }
  return (HPDF_STATUS)fontdef_local;
}

Assistant:

HPDF_STATUS
HPDF_CIDFontDef_ChangeStyle  (HPDF_FontDef   fontdef,
                              HPDF_BOOL      bold,
                              HPDF_BOOL      italic)
{
    HPDF_PTRACE ((" HPDF_CIDFontDef_ChangeStyle\n"));

    if (!fontdef || !fontdef->attr)
        return HPDF_INVALID_FONTDEF_DATA;

    if (bold) {
        fontdef->stemv *= 2;
        fontdef->flags |= HPDF_FONT_FOURCE_BOLD;
    }

    if (italic) {
        fontdef->italic_angle -= 11;
        fontdef->flags |= HPDF_FONT_ITALIC;
    }

    return HPDF_OK;
}